

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManSetPhasePattern(Gia_Man_t *p,Vec_Int_t *vCiValues)

{
  int i;
  uint uVar1;
  Gia_Obj_t *pObj;
  int v;
  
  if (p->vCis->nSize != vCiValues->nSize) {
    __assert_fail("Gia_ManCiNum(p) == Vec_IntSize(vCiValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaUtil.c"
                  ,0x186,"void Gia_ManSetPhasePattern(Gia_Man_t *, Vec_Int_t *)");
  }
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x9fffffff) == 0) {
      i = Gia_ObjCioId(pObj);
      uVar1 = Vec_IntEntry(vCiValues,i);
      *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | (ulong)uVar1 << 0x3f;
    }
    else {
      Gia_ObjSetPhase(p,pObj);
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_ManSetPhasePattern( Gia_Man_t * p, Vec_Int_t * vCiValues )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(p) == Vec_IntSize(vCiValues) );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            pObj->fPhase = Vec_IntEntry( vCiValues, Gia_ObjCioId(pObj) );
        else
            Gia_ObjSetPhase( p, pObj );
}